

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::isNamespaceBindingActive
          (DOMLSSerializerImpl *this,XMLCh *prefix,XMLCh *uri)

{
  bool bVar1;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  char16_t *str1;
  XMLCh *thisUri;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *curNamespaceMap;
  XMLSize_t i;
  XMLCh *uri_local;
  XMLCh *prefix_local;
  DOMLSSerializerImpl *this_local;
  
  curNamespaceMap =
       (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
       BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>::size
                 (&this->fNamespaceStack->
                   super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>
                 );
  while( true ) {
    if (curNamespaceMap == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
      return false;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>::
              elementAt(&this->fNamespaceStack->
                         super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>
                        ,(XMLSize_t)&curNamespaceMap[-1].field_0x37);
    str1 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this_00,prefix);
    if (str1 != (char16_t *)0x0) break;
    curNamespaceMap =
         (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)&curNamespaceMap[-1].field_0x37;
  }
  bVar1 = XMLString::equals(str1,uri);
  return bVar1;
}

Assistant:

bool DOMLSSerializerImpl::isNamespaceBindingActive(const XMLCh* prefix, const XMLCh* uri) const
{
    for(XMLSize_t i=fNamespaceStack->size();i>0;i--)
    {
        RefHashTableOf<XMLCh>* curNamespaceMap=fNamespaceStack->elementAt(i-1);
        const XMLCh* thisUri=curNamespaceMap->get((void*)prefix);
        // if the prefix has been declared, check if it binds to the correct namespace, otherwise, reports it isn't bound
        if(thisUri)
            return XMLString::equals(thisUri,uri);
    }
    return false;
}